

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.h
# Opt level: O0

void __thiscall
dap::ResponseOrError<dap::CMakeInitializeResponse>::~ResponseOrError
          (ResponseOrError<dap::CMakeInitializeResponse> *this)

{
  ResponseOrError<dap::CMakeInitializeResponse> *this_local;
  
  Error::~Error(&this->error);
  CMakeInitializeResponse::~CMakeInitializeResponse(&this->response);
  return;
}

Assistant:

inline ResponseOrError() = default;